

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

int run_test_tcp_open_connected(void)

{
  uv_stream_t *handle;
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar3;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  int iVar4;
  uv_handle_t **ppuVar5;
  uv_connect_cb p_Var6;
  void **ppvVar7;
  undefined1 *puVar8;
  uv_shutdown_t *puVar9;
  uv_handle_t *puVar10;
  uv_connect_t *puVar11;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_tcp_t client;
  undefined1 auStack_1b8 [16];
  uv_buf_t uStack_1a8;
  uv_loop_t *puStack_198;
  uv_handle_t *puStack_190;
  undefined1 auStack_188 [24];
  uv_loop_t *puStack_170;
  void **ppvStack_160;
  void **ppvStack_158;
  void *pvStack_148;
  undefined1 auStack_140 [16];
  uv__queue *puStack_130;
  uv__queue *puStack_128;
  uv__queue *puStack_120;
  uv_handle_t *local_110;
  uv_handle_t *local_108;
  uv_buf_t local_100;
  sockaddr_in local_f0;
  uv_tcp_t local_e0;
  
  puStack_120 = (uv__queue *)0x1c9d22;
  local_100 = uv_buf_init("PING",4);
  puStack_120 = (uv__queue *)0x1c9d42;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_f0);
  local_e0.data = (void *)(long)iVar1;
  local_110 = (uv_handle_t *)0x0;
  if (local_e0.data == (void *)0x0) {
    puStack_120 = (uv__queue *)0x1c9d67;
    uVar2 = create_tcp_socket();
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    puStack_120 = (uv__queue *)0x1c9d7a;
    iVar1 = connect(uVar2,(sockaddr *)&local_f0,0x10);
    local_e0.data = (void *)(long)iVar1;
    local_110 = (uv_handle_t *)0x0;
    if (local_e0.data != (void *)0x0) goto LAB_001c9f97;
    puStack_120 = (uv__queue *)0x1c9d9f;
    puVar3 = uv_default_loop();
    puStack_120 = (uv__queue *)0x1c9dac;
    iVar1 = uv_tcp_init(puVar3,&local_e0);
    local_110 = (uv_handle_t *)(long)iVar1;
    local_108 = (uv_handle_t *)0x0;
    if (local_110 != (uv_handle_t *)0x0) goto LAB_001c9fa6;
    puStack_120 = (uv__queue *)0x1c9dd8;
    iVar1 = uv_tcp_open(&local_e0,uVar2);
    local_110 = (uv_handle_t *)(long)iVar1;
    local_108 = (uv_handle_t *)0x0;
    if (local_110 != (uv_handle_t *)0x0) goto LAB_001c9fb5;
    puStack_120 = (uv__queue *)0x1c9e1a;
    iVar1 = uv_write(&write_req,(uv_stream_t *)&local_e0,&local_100,1,write_cb);
    local_110 = (uv_handle_t *)(long)iVar1;
    local_108 = (uv_handle_t *)0x0;
    if (local_110 != (uv_handle_t *)0x0) goto LAB_001c9fc4;
    puStack_120 = (uv__queue *)0x1c9e52;
    iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)&local_e0,shutdown_cb);
    local_110 = (uv_handle_t *)(long)iVar1;
    local_108 = (uv_handle_t *)0x0;
    if (local_110 != (uv_handle_t *)0x0) goto LAB_001c9fd3;
    puStack_120 = (uv__queue *)0x1c9e8a;
    iVar1 = uv_read_start((uv_stream_t *)&local_e0,alloc_cb,read_cb);
    local_110 = (uv_handle_t *)(long)iVar1;
    local_108 = (uv_handle_t *)0x0;
    if (local_110 != (uv_handle_t *)0x0) goto LAB_001c9fe2;
    puStack_120 = (uv__queue *)0x1c9eaf;
    puVar3 = uv_default_loop();
    puStack_120 = (uv__queue *)0x1c9eb9;
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_110 = (uv_handle_t *)0x1;
    local_108 = (uv_handle_t *)(long)shutdown_cb_called;
    if (local_108 != (uv_handle_t *)0x1) goto LAB_001c9ff1;
    local_110 = (uv_handle_t *)0x1;
    local_108 = (uv_handle_t *)(long)write_cb_called;
    if (local_108 != (uv_handle_t *)0x1) goto LAB_001ca000;
    local_110 = (uv_handle_t *)0x1;
    local_108 = (uv_handle_t *)(long)close_cb_called;
    if (local_108 != (uv_handle_t *)0x1) goto LAB_001ca00f;
    puStack_120 = (uv__queue *)0x1c9f2d;
    unaff_RBX = uv_default_loop();
    puStack_120 = (uv__queue *)0x1c9f41;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_120 = (uv__queue *)0x1c9f4b;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_110 = (uv_handle_t *)0x0;
    puStack_120 = (uv__queue *)0x1c9f59;
    puVar3 = uv_default_loop();
    puStack_120 = (uv__queue *)0x1c9f61;
    iVar1 = uv_loop_close(puVar3);
    local_108 = (uv_handle_t *)(long)iVar1;
    if (local_110 == local_108) {
      puStack_120 = (uv__queue *)0x1c9f7d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_120 = (uv__queue *)0x1c9f97;
    run_test_tcp_open_connected_cold_1();
LAB_001c9f97:
    puStack_120 = (uv__queue *)0x1c9fa6;
    run_test_tcp_open_connected_cold_2();
LAB_001c9fa6:
    puStack_120 = (uv__queue *)0x1c9fb5;
    run_test_tcp_open_connected_cold_3();
LAB_001c9fb5:
    puStack_120 = (uv__queue *)0x1c9fc4;
    run_test_tcp_open_connected_cold_4();
LAB_001c9fc4:
    puStack_120 = (uv__queue *)0x1c9fd3;
    run_test_tcp_open_connected_cold_5();
LAB_001c9fd3:
    puStack_120 = (uv__queue *)0x1c9fe2;
    run_test_tcp_open_connected_cold_6();
LAB_001c9fe2:
    puStack_120 = (uv__queue *)0x1c9ff1;
    run_test_tcp_open_connected_cold_7();
LAB_001c9ff1:
    puStack_120 = (uv__queue *)0x1ca000;
    run_test_tcp_open_connected_cold_8();
LAB_001ca000:
    puStack_120 = (uv__queue *)0x1ca00f;
    run_test_tcp_open_connected_cold_9();
LAB_001ca00f:
    puStack_120 = (uv__queue *)0x1ca01e;
    run_test_tcp_open_connected_cold_10();
  }
  puVar8 = auStack_140 + 0x30;
  ppuVar5 = &local_108;
  puStack_120 = (uv__queue *)write_cb;
  run_test_tcp_open_connected_cold_11();
  if (puVar8 == (undefined1 *)0x0) {
    puStack_128 = (uv__queue *)0x1ca044;
    write_cb_cold_2();
  }
  else if ((int)ppuVar5 == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  iVar1 = (int)ppuVar5;
  puVar9 = (uv_shutdown_t *)((ulong)ppuVar5 & 0xffffffff);
  puStack_128 = (uv__queue *)shutdown_cb;
  write_cb_cold_1();
  if (puVar9 == &shutdown_req) {
    puStack_128 = (uv__queue *)(long)iVar1;
    puStack_130 = (uv__queue *)0x0;
    if (puStack_128 == (uv__queue *)0x0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return iVar1;
    }
  }
  else {
    auStack_140._0_8_ = (uv_connect_cb)0x1ca088;
    shutdown_cb_cold_1();
  }
  p_Var6 = (uv_connect_cb)(auStack_140 + 0x10);
  auStack_140._0_8_ = alloc_cb;
  shutdown_cb_cold_2();
  pvStack_148 = (void *)0x10000;
  if ((long)p_Var6 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x39a700;
  }
  puVar10 = (uv_handle_t *)auStack_140;
  ppvVar7 = &pvStack_148;
  ppvStack_158 = (void **)read_cb;
  auStack_140._0_8_ = p_Var6;
  alloc_cb_cold_1();
  if (puVar10 == (uv_handle_t *)0x0) {
    puStack_170 = (uv_loop_t *)0x1ca168;
    read_cb_cold_4();
LAB_001ca168:
    puStack_170 = (uv_loop_t *)0x1ca177;
    read_cb_cold_2();
LAB_001ca177:
    puStack_170 = (uv_loop_t *)0x1ca186;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)ppvVar7) {
      ppvStack_158 = (void **)0x4;
      ppvStack_160 = ppvVar7;
      if (ppvVar7 != (void **)0x4) goto LAB_001ca168;
      puStack_170 = (uv_loop_t *)0x1ca118;
      iVar1 = memcmp("PING",(void *)*extraout_RDX_00,4);
      ppvStack_158 = (void **)(long)iVar1;
      ppvStack_160 = (void **)0x0;
      if (ppvStack_158 == (void **)0x0) {
        return iVar1;
      }
      goto LAB_001ca177;
    }
    ppvStack_160 = (void **)0xfffffffffffff001;
    ppvStack_158 = ppvVar7;
    if (ppvVar7 == (void **)0xfffffffffffff001) {
      uv_close(puVar10,close_cb);
      return extraout_EAX_00;
    }
  }
  puStack_170 = (uv_loop_t *)run_test_tcp_write_ready;
  read_cb_cold_1();
  iVar4 = (int)&puStack_190;
  puStack_198 = (uv_loop_t *)0x1ca1b0;
  puStack_170 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(auStack_188 + 8));
  auStack_188._0_8_ = SEXT48(iVar1);
  puStack_190 = (uv_handle_t *)0x0;
  if ((uv_handle_t *)auStack_188._0_8_ == (uv_handle_t *)0x0) {
    puStack_198 = (uv_loop_t *)0x1ca1d3;
    uVar2 = create_tcp_socket();
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    puStack_198 = (uv_loop_t *)0x1ca1da;
    puVar3 = uv_default_loop();
    puStack_198 = (uv_loop_t *)0x1ca1e9;
    iVar1 = uv_tcp_init(puVar3,&::client);
    auStack_188._0_8_ = SEXT48(iVar1);
    puStack_190 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_188._0_8_ != (uv_handle_t *)0x0) goto LAB_001ca396;
    puStack_198 = (uv_loop_t *)0x1ca215;
    iVar1 = uv_tcp_open(&::client,uVar2);
    auStack_188._0_8_ = SEXT48(iVar1);
    puStack_190 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_188._0_8_ != (uv_handle_t *)0x0) goto LAB_001ca3a3;
    puStack_198 = (uv_loop_t *)0x1ca252;
    iVar1 = uv_tcp_connect(&connect_req,&::client,(sockaddr *)(auStack_188 + 8),connect1_cb);
    auStack_188._0_8_ = SEXT48(iVar1);
    puStack_190 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_188._0_8_ != (uv_handle_t *)0x0) goto LAB_001ca3b0;
    puStack_198 = (uv_loop_t *)0x1ca275;
    puVar3 = uv_default_loop();
    puStack_198 = (uv_loop_t *)0x1ca27f;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_188._0_8_ = (uv_handle_t *)0x1;
    puStack_190 = (uv_handle_t *)(long)shutdown_cb_called;
    if (puStack_190 != (uv_handle_t *)0x1) goto LAB_001ca3bd;
    auStack_188._0_8_ = (uv_handle_t *)0x1;
    puStack_190 = (uv_handle_t *)(long)shutdown_requested;
    if (puStack_190 != (uv_handle_t *)0x1) goto LAB_001ca3ca;
    auStack_188._0_8_ = (uv_handle_t *)0x1;
    puStack_190 = (uv_handle_t *)(long)connect_cb_called;
    if (puStack_190 != (uv_handle_t *)0x1) goto LAB_001ca3d7;
    auStack_188._0_8_ = SEXT48(write_cb_called);
    puStack_190 = (uv_handle_t *)0x0;
    if ((long)auStack_188._0_8_ < 1) goto LAB_001ca3e4;
    auStack_188._0_8_ = (uv_handle_t *)0x1;
    puStack_190 = (uv_handle_t *)(long)close_cb_called;
    if (puStack_190 != (uv_handle_t *)0x1) goto LAB_001ca3f1;
    puStack_198 = (uv_loop_t *)0x1ca333;
    unaff_RBX = uv_default_loop();
    puStack_198 = (uv_loop_t *)0x1ca347;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_198 = (uv_loop_t *)0x1ca351;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    auStack_188._0_8_ = (uv_handle_t *)0x0;
    puStack_198 = (uv_loop_t *)0x1ca35f;
    puVar3 = uv_default_loop();
    puStack_198 = (uv_loop_t *)0x1ca367;
    iVar1 = uv_loop_close(puVar3);
    puStack_190 = (uv_handle_t *)(long)iVar1;
    if ((uv_handle_t *)auStack_188._0_8_ == puStack_190) {
      puStack_198 = (uv_loop_t *)0x1ca381;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_198 = (uv_loop_t *)0x1ca396;
    run_test_tcp_write_ready_cold_1();
LAB_001ca396:
    puStack_198 = (uv_loop_t *)0x1ca3a3;
    run_test_tcp_write_ready_cold_2();
LAB_001ca3a3:
    puStack_198 = (uv_loop_t *)0x1ca3b0;
    run_test_tcp_write_ready_cold_3();
LAB_001ca3b0:
    puStack_198 = (uv_loop_t *)0x1ca3bd;
    run_test_tcp_write_ready_cold_4();
LAB_001ca3bd:
    puStack_198 = (uv_loop_t *)0x1ca3ca;
    run_test_tcp_write_ready_cold_5();
LAB_001ca3ca:
    puStack_198 = (uv_loop_t *)0x1ca3d7;
    run_test_tcp_write_ready_cold_6();
LAB_001ca3d7:
    puStack_198 = (uv_loop_t *)0x1ca3e4;
    run_test_tcp_write_ready_cold_7();
LAB_001ca3e4:
    puStack_198 = (uv_loop_t *)0x1ca3f1;
    run_test_tcp_write_ready_cold_8();
LAB_001ca3f1:
    puStack_198 = (uv_loop_t *)0x1ca3fe;
    run_test_tcp_write_ready_cold_9();
  }
  puVar11 = (uv_connect_t *)auStack_188;
  puStack_198 = (uv_loop_t *)connect1_cb;
  run_test_tcp_write_ready_cold_10();
  handle = connect_req.handle;
  puVar10 = (uv_handle_t *)auStack_1b8;
  puStack_198 = unaff_RBX;
  if (puVar11 == &connect_req) {
    uStack_1a8.base = (char *)(long)iVar4;
    auStack_1b8._0_8_ = (void *)0x0;
    if ((char *)(long)iVar4 != (char *)0x0) goto LAB_001ca546;
    connect_cb_called = connect_cb_called + 1;
    puVar3 = uv_default_loop();
    iVar1 = uv_timer_init(puVar3,&tm);
    uStack_1a8.base = (char *)(long)iVar1;
    auStack_1b8._0_8_ = (void *)0x0;
    if ((char *)(long)iVar1 != (char *)0x0) goto LAB_001ca553;
    iVar1 = uv_timer_start(&tm,timer_cb,2000,0);
    uStack_1a8.base = (char *)(long)iVar1;
    auStack_1b8._0_8_ = (void *)0x0;
    if ((char *)(long)iVar1 != (char *)0x0) goto LAB_001ca560;
    uStack_1a8 = uv_buf_init("P",1);
    iVar1 = uv_write(&write_req,handle,&uStack_1a8,1,write1_cb);
    auStack_1b8._0_8_ = SEXT48(iVar1);
    auStack_1b8._8_8_ = (uv_loop_t *)0x0;
    if ((void *)auStack_1b8._0_8_ == (void *)0x0) {
      iVar1 = uv_read_start(handle,alloc_cb,read1_cb);
      auStack_1b8._0_8_ = SEXT48(iVar1);
      auStack_1b8._8_8_ = (uv_loop_t *)0x0;
      if ((void *)auStack_1b8._0_8_ == (void *)0x0) {
        return iVar1;
      }
      goto LAB_001ca57a;
    }
  }
  else {
    connect1_cb_cold_1();
LAB_001ca546:
    connect1_cb_cold_2();
LAB_001ca553:
    connect1_cb_cold_3();
LAB_001ca560:
    connect1_cb_cold_4();
  }
  connect1_cb_cold_5();
LAB_001ca57a:
  connect1_cb_cold_6();
  iVar1 = uv_is_closing(puVar10);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(puVar10,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(tcp_open_connected) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  uv_os_sock_t sock;
  uv_buf_t buf = uv_buf_init("PING", 4);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_tcp_socket();

  ASSERT_OK(connect(sock, (struct sockaddr*) &addr,  sizeof(addr)));

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &client));

  ASSERT_OK(uv_tcp_open(&client, sock));

  ASSERT_OK(uv_write(&write_req,
                     (uv_stream_t*) &client,
                     &buf,
                     1,
                     write_cb));

  ASSERT_OK(uv_shutdown(&shutdown_req,
                        (uv_stream_t*) &client,
                        shutdown_cb));

  ASSERT_OK(uv_read_start((uv_stream_t*) &client, alloc_cb, read_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, shutdown_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}